

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O3

ma_result ma_linear_resampler_process_pcm_frames
                    (ma_linear_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint32 *pmVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ma_format mVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ma_uint64 mVar15;
  ulong uVar16;
  float *pfVar17;
  ma_lpf1 *pmVar18;
  ma_biquad_coefficient *pmVar19;
  ma_lpf2 *pmVar20;
  float *pfVar21;
  ma_uint32 mVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ma_uint64 mVar26;
  ma_uint64 mVar27;
  undefined2 uVar28;
  int iVar29;
  ma_uint64 mVar30;
  ma_int16 mVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  ma_int16 *local_78;
  ma_uint64 local_70;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    return MA_INVALID_ARGS;
  }
  mVar8 = (pResampler->config).format;
  if (mVar8 == ma_format_f32) {
    uVar36 = (pResampler->config).sampleRateOut;
    if (uVar36 < (pResampler->config).sampleRateIn) {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x97ee,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x97ef,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar15 = *pFrameCountOut;
      if (mVar15 != 0) {
        uVar16 = *pFrameCountIn;
        mVar22 = pResampler->inTimeInt;
        mVar26 = 0;
        mVar30 = 0;
        do {
          bVar37 = mVar22 != 0;
          if (mVar30 < uVar16 && bVar37) {
            do {
              uVar25 = (ulong)(pResampler->config).channels;
              if (pFramesIn == (void *)0x0) {
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    (pResampler->x0).f32[uVar24] = (pResampler->x1).f32[uVar24];
                    (pResampler->x1).f32[uVar24] = 0.0;
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar25 == 0) {
                  uVar25 = 0;
                }
                else {
                  uVar24 = 0;
                  do {
                    (pResampler->x0).f32[uVar24] = (pResampler->x1).f32[uVar24];
                    (pResampler->x1).f32[uVar24] = *(float *)((long)pFramesIn + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar25 * 4);
              }
              if ((pResampler->lpf).format != ma_format_f32) goto LAB_001a13b8;
              pfVar17 = (pResampler->x1).f32;
              if ((pResampler->lpf).lpf1Count != 0) {
                uVar25 = 0;
                do {
                  pmVar18 = (pResampler->lpf).pLPF1;
                  uVar36 = pmVar18[uVar25].channels;
                  fVar2 = pmVar18[uVar25].a.f32;
                  uVar24 = 0;
                  do {
                    pmVar19 = pmVar18[uVar25].pR1;
                    fVar38 = pfVar17[uVar24] * (1.0 - fVar2) + pmVar19[uVar24].f32 * fVar2;
                    pfVar17[uVar24] = fVar38;
                    pmVar19[uVar24].f32 = fVar38;
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                  uVar25 = uVar25 + 1;
                } while (uVar25 < (pResampler->lpf).lpf1Count);
              }
              if ((pResampler->lpf).lpf2Count != 0) {
                uVar25 = 0;
                do {
                  pmVar20 = (pResampler->lpf).pLPF2;
                  uVar36 = pmVar20[uVar25].bq.channels;
                  fVar2 = pmVar20[uVar25].bq.b0.f32;
                  fVar38 = pmVar20[uVar25].bq.b1.f32;
                  fVar3 = pmVar20[uVar25].bq.b2.f32;
                  fVar4 = pmVar20[uVar25].bq.a1.f32;
                  fVar5 = pmVar20[uVar25].bq.a2.f32;
                  uVar24 = 0;
                  do {
                    pmVar19 = pmVar20[uVar25].bq.pR1;
                    fVar6 = pfVar17[uVar24];
                    fVar39 = fVar2 * fVar6 + pmVar19[uVar24].f32;
                    fVar7 = pmVar20[uVar25].bq.pR2[uVar24].f32;
                    pfVar17[uVar24] = fVar39;
                    pmVar19[uVar24].f32 = fVar38 * fVar6 + fVar39 * -fVar4 + fVar7;
                    pmVar20[uVar25].bq.pR2[uVar24].f32 = fVar6 * fVar3 + fVar39 * -fVar5;
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                  uVar25 = uVar25 + 1;
                } while (uVar25 < (pResampler->lpf).lpf2Count);
              }
              mVar30 = mVar30 + 1;
              pmVar1 = &pResampler->inTimeInt;
              *pmVar1 = *pmVar1 - 1;
              bVar37 = *pmVar1 != 0;
            } while ((bVar37) && (mVar30 < uVar16));
          }
          mVar27 = mVar26;
          if (bVar37) break;
          uVar36 = (pResampler->config).sampleRateOut;
          uVar23 = pResampler->inTimeFrac;
          if (pFramesOut == (void *)0x0) {
            pFramesOut = (void *)0x0;
          }
          else {
            uVar25 = (ulong)(pResampler->config).channels;
            pfVar17 = (pResampler->x0).f32;
            pfVar21 = (pResampler->x1).f32;
            uVar24 = 0;
            do {
              *(float *)((long)pFramesOut + uVar24 * 4) =
                   (pfVar21[uVar24] - pfVar17[uVar24]) * ((float)uVar23 / (float)uVar36) +
                   pfVar17[uVar24];
              uVar24 = uVar24 + 1;
            } while (uVar25 != uVar24);
            pFramesOut = (void *)((long)pFramesOut + uVar25 * 4);
          }
          mVar22 = pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar22;
          uVar23 = uVar23 + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar23;
          if (uVar36 <= uVar23) {
            pResampler->inTimeFrac = uVar23 - uVar36;
            mVar22 = mVar22 + 1;
            pResampler->inTimeInt = mVar22;
          }
          mVar26 = mVar26 + 1;
          mVar27 = mVar15;
        } while (mVar26 != mVar15);
        goto LAB_001a1390;
      }
    }
    else {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9838,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9839,
                      "ma_result ma_linear_resampler_process_pcm_frames_f32_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar15 = *pFrameCountOut;
      if (mVar15 != 0) {
        uVar16 = *pFrameCountIn;
        mVar22 = pResampler->inTimeInt;
        mVar26 = 0;
        mVar30 = 0;
        do {
          if (mVar30 < uVar16 && mVar22 != 0) {
            uVar25 = (ulong)(pResampler->config).channels;
            do {
              if (pFramesIn == (void *)0x0) {
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    (pResampler->x0).f32[uVar24] = (pResampler->x1).f32[uVar24];
                    (pResampler->x1).f32[uVar24] = 0.0;
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    (pResampler->x0).f32[uVar24] = (pResampler->x1).f32[uVar24];
                    (pResampler->x1).f32[uVar24] = *(float *)((long)pFramesIn + uVar24 * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar25 * 4);
              }
              mVar30 = mVar30 + 1;
              mVar22 = mVar22 - 1;
            } while ((mVar22 != 0) && (mVar30 < uVar16));
            pResampler->inTimeInt = mVar22;
          }
          mVar27 = mVar26;
          if (mVar22 != 0) break;
          uVar23 = pResampler->inTimeFrac;
          if (pFramesOut == (void *)0x0) {
            mVar22 = 0;
            pFramesOut = (void *)0x0;
          }
          else {
            uVar14 = (pResampler->config).channels;
            pfVar17 = (pResampler->x0).f32;
            pfVar21 = (pResampler->x1).f32;
            uVar25 = 0;
            do {
              *(float *)((long)pFramesOut + uVar25 * 4) =
                   (pfVar21[uVar25] - pfVar17[uVar25]) * ((float)uVar23 / (float)uVar36) +
                   pfVar17[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar14 != uVar25);
            if ((pResampler->lpf).format != ma_format_f32) {
LAB_001a13b8:
              __assert_fail("pLPF->format == ma_format_f32",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x84e1,
                            "void ma_lpf_process_pcm_frame_f32(ma_lpf *, float *, const void *)");
            }
            if ((pResampler->lpf).lpf1Count != 0) {
              uVar25 = 0;
              do {
                pmVar18 = (pResampler->lpf).pLPF1;
                uVar36 = pmVar18[uVar25].channels;
                fVar2 = pmVar18[uVar25].a.f32;
                uVar24 = 0;
                do {
                  pmVar19 = pmVar18[uVar25].pR1;
                  fVar38 = *(float *)((long)pFramesOut + uVar24 * 4) * (1.0 - fVar2) +
                           pmVar19[uVar24].f32 * fVar2;
                  *(float *)((long)pFramesOut + uVar24 * 4) = fVar38;
                  pmVar19[uVar24].f32 = fVar38;
                  uVar24 = uVar24 + 1;
                } while (uVar36 != uVar24);
                uVar25 = uVar25 + 1;
              } while (uVar25 < (pResampler->lpf).lpf1Count);
            }
            if ((pResampler->lpf).lpf2Count != 0) {
              uVar25 = 0;
              do {
                pmVar20 = (pResampler->lpf).pLPF2;
                uVar36 = pmVar20[uVar25].bq.channels;
                fVar2 = pmVar20[uVar25].bq.b0.f32;
                fVar38 = pmVar20[uVar25].bq.b1.f32;
                fVar3 = pmVar20[uVar25].bq.b2.f32;
                fVar4 = pmVar20[uVar25].bq.a1.f32;
                fVar5 = pmVar20[uVar25].bq.a2.f32;
                uVar24 = 0;
                do {
                  pmVar19 = pmVar20[uVar25].bq.pR1;
                  fVar6 = *(float *)((long)pFramesOut + uVar24 * 4);
                  fVar39 = fVar2 * fVar6 + pmVar19[uVar24].f32;
                  fVar7 = pmVar20[uVar25].bq.pR2[uVar24].f32;
                  *(float *)((long)pFramesOut + uVar24 * 4) = fVar39;
                  pmVar19[uVar24].f32 = fVar38 * fVar6 + fVar39 * -fVar4 + fVar7;
                  pmVar20[uVar25].bq.pR2[uVar24].f32 = fVar6 * fVar3 + fVar39 * -fVar5;
                  uVar24 = uVar24 + 1;
                } while (uVar36 != uVar24);
                uVar25 = uVar25 + 1;
              } while (uVar25 < (pResampler->lpf).lpf2Count);
            }
            uVar36 = (pResampler->config).sampleRateOut;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 4);
            mVar22 = pResampler->inTimeInt;
            uVar23 = pResampler->inTimeFrac;
          }
          mVar22 = mVar22 + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar22;
          uVar23 = uVar23 + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar23;
          if (uVar36 <= uVar23) {
            pResampler->inTimeFrac = uVar23 - uVar36;
            mVar22 = mVar22 + 1;
            pResampler->inTimeInt = mVar22;
          }
          mVar26 = mVar26 + 1;
          mVar27 = mVar15;
        } while (mVar26 != mVar15);
        goto LAB_001a1390;
      }
    }
  }
  else {
    if (mVar8 != ma_format_s16) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0x9890,
                    "ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                   );
    }
    uVar36 = (pResampler->config).sampleRateOut;
    if (uVar36 < (pResampler->config).sampleRateIn) {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x974e,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x974f,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_downsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar15 = *pFrameCountOut;
      if (mVar15 != 0) {
        uVar16 = *pFrameCountIn;
        mVar22 = pResampler->inTimeInt;
        local_70 = 0;
        mVar30 = 0;
        local_78 = (ma_int16 *)pFramesOut;
        do {
          bVar37 = mVar22 != 0;
          if (mVar30 < uVar16 && bVar37) {
            do {
              uVar25 = (ulong)(pResampler->config).channels;
              if (pFramesIn == (void *)0x0) {
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar24 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2) = 0;
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar25 == 0) {
                  uVar25 = 0;
                }
                else {
                  uVar24 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar24 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2) =
                         *(undefined2 *)((long)pFramesIn + uVar24 * 2);
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar25 * 2);
              }
              if ((pResampler->lpf).format != ma_format_s16) goto LAB_001a13d7;
              pfVar17 = (pResampler->x1).f32;
              if ((pResampler->lpf).lpf1Count != 0) {
                uVar25 = 0;
                do {
                  pmVar18 = (pResampler->lpf).pLPF1;
                  uVar36 = pmVar18[uVar25].channels;
                  iVar9 = pmVar18[uVar25].a.s32;
                  uVar24 = 0;
                  do {
                    pmVar19 = pmVar18[uVar25].pR1;
                    iVar33 = pmVar19[uVar24].s32 * iVar9 +
                             (int)*(short *)((long)pfVar17 + uVar24 * 2) * (0x4000 - iVar9) >> 0xe;
                    *(short *)((long)pfVar17 + uVar24 * 2) = (short)iVar33;
                    pmVar19[uVar24].s32 = iVar33;
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                  uVar25 = uVar25 + 1;
                } while (uVar25 < (pResampler->lpf).lpf1Count);
              }
              if ((pResampler->lpf).lpf2Count != 0) {
                uVar25 = 0;
                do {
                  pmVar20 = (pResampler->lpf).pLPF2;
                  uVar36 = pmVar20[uVar25].bq.channels;
                  iVar9 = pmVar20[uVar25].bq.b0.s32;
                  iVar33 = pmVar20[uVar25].bq.b1.s32;
                  iVar10 = pmVar20[uVar25].bq.b2.s32;
                  iVar11 = pmVar20[uVar25].bq.a1.s32;
                  iVar12 = pmVar20[uVar25].bq.a2.s32;
                  uVar24 = 0;
                  do {
                    pmVar19 = pmVar20[uVar25].bq.pR1;
                    iVar32 = (int)*(short *)((long)pfVar17 + uVar24 * 2);
                    iVar13 = pmVar20[uVar25].bq.pR2[uVar24].s32;
                    iVar29 = iVar9 * iVar32 + pmVar19[uVar24].s32 >> 0xe;
                    iVar34 = iVar11 * iVar29;
                    iVar35 = iVar29 * iVar12;
                    if (0x7ffe < iVar29) {
                      iVar29 = 0x7fff;
                    }
                    uVar28 = (undefined2)iVar29;
                    if (iVar29 < -0x7fff) {
                      uVar28 = 0x8000;
                    }
                    *(undefined2 *)((long)pfVar17 + uVar24 * 2) = uVar28;
                    pmVar19[uVar24].s32 = (iVar33 * iVar32 + iVar13) - iVar34;
                    pmVar20[uVar25].bq.pR2[uVar24].s32 = iVar32 * iVar10 - iVar35;
                    uVar24 = uVar24 + 1;
                  } while (uVar36 != uVar24);
                  uVar25 = uVar25 + 1;
                } while (uVar25 < (pResampler->lpf).lpf2Count);
              }
              mVar30 = mVar30 + 1;
              mVar22 = pResampler->inTimeInt - 1;
              bVar37 = mVar22 != 0;
              pResampler->inTimeInt = mVar22;
            } while ((bVar37) && (mVar30 < uVar16));
          }
          mVar27 = local_70;
          if (bVar37) break;
          if (local_78 == (ma_int16 *)0x0) {
            local_78 = (ma_int16 *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_s16(pResampler,local_78);
            mVar22 = pResampler->inTimeInt;
            local_78 = local_78 + (pResampler->config).channels;
          }
          mVar22 = mVar22 + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar22;
          uVar36 = (pResampler->config).sampleRateOut;
          uVar23 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar23;
          if (uVar36 <= uVar23) {
            pResampler->inTimeFrac = uVar23 - uVar36;
            mVar22 = mVar22 + 1;
            pResampler->inTimeInt = mVar22;
          }
          local_70 = local_70 + 1;
          mVar27 = mVar15;
        } while (local_70 != mVar15);
        goto LAB_001a1390;
      }
    }
    else {
      if (pFrameCountIn == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountIn != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9798,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      if (pFrameCountOut == (ma_uint64 *)0x0) {
        __assert_fail("pFrameCountOut != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                      ,0x9799,
                      "ma_result ma_linear_resampler_process_pcm_frames_s16_upsample(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                     );
      }
      mVar15 = *pFrameCountOut;
      if (mVar15 != 0) {
        uVar16 = *pFrameCountIn;
        mVar22 = pResampler->inTimeInt;
        mVar26 = 0;
        mVar30 = 0;
        do {
          if (mVar30 < uVar16 && mVar22 != 0) {
            uVar25 = (ulong)(pResampler->config).channels;
            do {
              if (pFramesIn == (void *)0x0) {
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar24 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2) = 0;
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)0x0;
              }
              else {
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    *(undefined2 *)((long)(pResampler->x0).f32 + uVar24 * 2) =
                         *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2);
                    *(undefined2 *)((long)(pResampler->x1).f32 + uVar24 * 2) =
                         *(undefined2 *)((long)pFramesIn + uVar24 * 2);
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                pFramesIn = (void *)((long)pFramesIn + uVar25 * 2);
              }
              mVar30 = mVar30 + 1;
              mVar22 = mVar22 - 1;
            } while ((mVar22 != 0) && (mVar30 < uVar16));
            pResampler->inTimeInt = mVar22;
          }
          mVar27 = mVar26;
          if (mVar22 != 0) break;
          if ((ma_int16 *)pFramesOut == (ma_int16 *)0x0) {
            mVar22 = 0;
            pFramesOut = (ma_int16 *)0x0;
          }
          else {
            ma_linear_resampler_interpolate_frame_s16(pResampler,(ma_int16 *)pFramesOut);
            if ((pResampler->lpf).format != ma_format_s16) {
LAB_001a13d7:
              __assert_fail("pLPF->format == ma_format_s16",
                            "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                            ,0x84f3,
                            "void ma_lpf_process_pcm_frame_s16(ma_lpf *, ma_int16 *, const ma_int16 *)"
                           );
            }
            if ((pResampler->lpf).lpf1Count != 0) {
              uVar25 = 0;
              do {
                pmVar18 = (pResampler->lpf).pLPF1;
                uVar36 = pmVar18[uVar25].channels;
                iVar9 = pmVar18[uVar25].a.s32;
                uVar24 = 0;
                do {
                  pmVar19 = pmVar18[uVar25].pR1;
                  iVar33 = pmVar19[uVar24].s32 * iVar9 +
                           (int)*(short *)((long)pFramesOut + uVar24 * 2) * (0x4000 - iVar9) >> 0xe;
                  *(ma_int16 *)((long)pFramesOut + uVar24 * 2) = (ma_int16)iVar33;
                  pmVar19[uVar24].s32 = iVar33;
                  uVar24 = uVar24 + 1;
                } while (uVar36 != uVar24);
                uVar25 = uVar25 + 1;
              } while (uVar25 < (pResampler->lpf).lpf1Count);
            }
            if ((pResampler->lpf).lpf2Count != 0) {
              uVar25 = 0;
              do {
                pmVar20 = (pResampler->lpf).pLPF2;
                uVar36 = pmVar20[uVar25].bq.channels;
                iVar9 = pmVar20[uVar25].bq.b0.s32;
                iVar33 = pmVar20[uVar25].bq.b1.s32;
                iVar10 = pmVar20[uVar25].bq.b2.s32;
                iVar11 = pmVar20[uVar25].bq.a1.s32;
                iVar12 = pmVar20[uVar25].bq.a2.s32;
                uVar24 = 0;
                do {
                  pmVar19 = pmVar20[uVar25].bq.pR1;
                  iVar29 = (int)*(short *)((long)pFramesOut + uVar24 * 2);
                  iVar13 = pmVar20[uVar25].bq.pR2[uVar24].s32;
                  iVar32 = iVar9 * iVar29 + pmVar19[uVar24].s32 >> 0xe;
                  iVar34 = iVar11 * iVar32;
                  iVar35 = iVar32 * iVar12;
                  if (0x7ffe < iVar32) {
                    iVar32 = 0x7fff;
                  }
                  mVar31 = (ma_int16)iVar32;
                  if (iVar32 < -0x7fff) {
                    mVar31 = -0x8000;
                  }
                  *(ma_int16 *)((long)pFramesOut + uVar24 * 2) = mVar31;
                  pmVar19[uVar24].s32 = (iVar33 * iVar29 + iVar13) - iVar34;
                  pmVar20[uVar25].bq.pR2[uVar24].s32 = iVar29 * iVar10 - iVar35;
                  uVar24 = uVar24 + 1;
                } while (uVar36 != uVar24);
                uVar25 = uVar25 + 1;
              } while (uVar25 < (pResampler->lpf).lpf2Count);
            }
            uVar36 = (pResampler->config).sampleRateOut;
            pFramesOut = (void *)((long)pFramesOut + (ulong)(pResampler->config).channels * 2);
            mVar22 = pResampler->inTimeInt;
          }
          mVar22 = mVar22 + pResampler->inAdvanceInt;
          pResampler->inTimeInt = mVar22;
          uVar23 = pResampler->inTimeFrac + pResampler->inAdvanceFrac;
          pResampler->inTimeFrac = uVar23;
          if (uVar36 <= uVar23) {
            pResampler->inTimeFrac = uVar23 - uVar36;
            mVar22 = mVar22 + 1;
            pResampler->inTimeInt = mVar22;
          }
          mVar26 = mVar26 + 1;
          mVar27 = mVar15;
        } while (mVar26 != mVar15);
        goto LAB_001a1390;
      }
    }
  }
  mVar30 = 0;
  mVar27 = 0;
LAB_001a1390:
  *pFrameCountIn = mVar30;
  *pFrameCountOut = mVar27;
  return MA_SUCCESS;
}

Assistant:

MA_API ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    /*  */ if (pResampler->config.format == ma_format_s16) {
        return ma_linear_resampler_process_pcm_frames_s16(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else if (pResampler->config.format == ma_format_f32) {
        return ma_linear_resampler_process_pcm_frames_f32(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else {
        /* Should never get here. Getting here means the format is not supported and you didn't check the return value of ma_linear_resampler_init(). */
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS;
    }
}